

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_Printer.h
# Opt level: O0

void __thiscall soul::heart::Printer::PrinterStream::printOutputs(PrinterStream *this)

{
  bool bVar1;
  vector<soul::pool_ref<soul::heart::OutputDeclaration>,_std::allocator<soul::pool_ref<soul::heart::OutputDeclaration>_>_>
  *this_00;
  reference ppVar2;
  CodePrinter *pCVar3;
  OutputDeclaration *pOVar4;
  OutputDeclaration *pOVar5;
  OutputDeclaration *pOVar6;
  char *__s;
  allocator<char> local_c1;
  string local_c0;
  string local_a0;
  string local_80;
  string local_60;
  pool_ref<soul::heart::OutputDeclaration> local_30;
  pool_ref<soul::heart::OutputDeclaration> io;
  const_iterator __end2;
  const_iterator __begin2;
  vector<soul::pool_ref<soul::heart::OutputDeclaration>,_std::allocator<soul::pool_ref<soul::heart::OutputDeclaration>_>_>
  *__range2;
  PrinterStream *this_local;
  
  this_00 = &this->module->outputs;
  __end2 = std::
           vector<soul::pool_ref<soul::heart::OutputDeclaration>,_std::allocator<soul::pool_ref<soul::heart::OutputDeclaration>_>_>
           ::begin(this_00);
  io.object = (OutputDeclaration *)
              std::
              vector<soul::pool_ref<soul::heart::OutputDeclaration>,_std::allocator<soul::pool_ref<soul::heart::OutputDeclaration>_>_>
              ::end(this_00);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<const_soul::pool_ref<soul::heart::OutputDeclaration>_*,_std::vector<soul::pool_ref<soul::heart::OutputDeclaration>,_std::allocator<soul::pool_ref<soul::heart::OutputDeclaration>_>_>_>
                                *)&io);
    if (!bVar1) break;
    ppVar2 = __gnu_cxx::
             __normal_iterator<const_soul::pool_ref<soul::heart::OutputDeclaration>_*,_std::vector<soul::pool_ref<soul::heart::OutputDeclaration>,_std::allocator<soul::pool_ref<soul::heart::OutputDeclaration>_>_>_>
             ::operator*(&__end2);
    pOVar6 = ppVar2->object;
    local_30.object = pOVar6;
    pCVar3 = choc::text::CodePrinter::operator<<(this->out,"output  ");
    pOVar4 = pool_ref<soul::heart::OutputDeclaration>::operator->(&local_30);
    pOVar5 = pool_ref<soul::heart::OutputDeclaration>::operator->(&local_30);
    nameWithArray_abi_cxx11_
              (&local_80,(PrinterStream *)&(pOVar4->super_IODeclaration).name,
               (Identifier *)&(pOVar5->super_IODeclaration).arraySize,
               (optional<unsigned_int> *)pOVar6);
    padded(&local_60,&local_80,0x14);
    pCVar3 = choc::text::CodePrinter::operator<<(pCVar3,&local_60);
    pOVar6 = pool_ref<soul::heart::OutputDeclaration>::operator->(&local_30);
    __s = getEndpointTypeName((pOVar6->super_IODeclaration).endpointType);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_c0,__s,&local_c1);
    padded(&local_a0,&local_c0,8);
    choc::text::CodePrinter::operator<<(pCVar3,&local_a0);
    std::__cxx11::string::~string((string *)&local_a0);
    std::__cxx11::string::~string((string *)&local_c0);
    std::allocator<char>::~allocator(&local_c1);
    std::__cxx11::string::~string((string *)&local_60);
    std::__cxx11::string::~string((string *)&local_80);
    pOVar6 = pool_ref<soul::heart::OutputDeclaration>::operator->(&local_30);
    printDescription(this,&(pOVar6->super_IODeclaration).dataTypes);
    pOVar6 = pool_ref<soul::heart::OutputDeclaration>::operator->(&local_30);
    printDescription(this,&(pOVar6->super_IODeclaration).annotation);
    pCVar3 = choc::text::CodePrinter::operator<<(this->out,';');
    choc::text::CodePrinter::operator<<(pCVar3,(NewLine *)&newLine);
    pool_ref<soul::heart::OutputDeclaration>::~pool_ref(&local_30);
    __gnu_cxx::
    __normal_iterator<const_soul::pool_ref<soul::heart::OutputDeclaration>_*,_std::vector<soul::pool_ref<soul::heart::OutputDeclaration>,_std::allocator<soul::pool_ref<soul::heart::OutputDeclaration>_>_>_>
    ::operator++(&__end2);
  }
  return;
}

Assistant:

void printOutputs()
        {
            for (auto io : module.outputs)
            {
                out << "output  "
                    << padded (nameWithArray (io->name, io->arraySize), 20)
                    << padded (getEndpointTypeName (io->endpointType), 8);

                printDescription (io->dataTypes);
                printDescription (io->annotation);
                out << ';' << newLine;
            }
        }